

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::createShader
          (MultipleBindingCase *this)

{
  bool bVar1;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  ProgramSources *pPVar2;
  TestLog *log;
  TestError *this_01;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_18a;
  allocator<char> local_189;
  string local_188;
  ShaderSource local_168;
  allocator<char> local_139;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_e0;
  MultipleBindingCase *local_10;
  MultipleBindingCase *this_local;
  
  local_10 = this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_18a = 1;
  renderCtx = Context::getRenderContext((this->super_BindingRenderCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
             ,&local_139);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar2 = glu::ProgramSources::operator<<(&local_e0,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "#version 310 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_189);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_168,&local_188);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,&local_168);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar2);
  local_18a = 0;
  (this->super_BindingRenderCase).m_program = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  glu::ProgramSources::~ProgramSources(&local_e0);
  log = tcu::TestContext::getLog
                  ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  glu::operator<<(log,(this->super_BindingRenderCase).m_program);
  bVar1 = glu::ShaderProgram::isOk((this->super_BindingRenderCase).m_program);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"could not build shader",&local_1b1);
    tcu::TestError::TestError(this_01,&local_1b0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void MultipleBindingCase::createShader (void)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_positionColorOffsetShader) << glu::FragmentSource(s_colorFragmentShader));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build shader");
}